

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
parse_full_uri(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  byte *pbVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  _func_int_void_ptr_uint *p_Var5;
  bool bVar6;
  uint uVar7;
  curi_status cVar8;
  curi_status cVar9;
  int iVar10;
  byte *pbVar11;
  char *pcVar12;
  code *pcVar13;
  byte bVar14;
  char *pcVar15;
  ulong uVar16;
  undefined7 uVar18;
  curi_settings *pcVar17;
  code *pcVar19;
  size_t sVar20;
  ulong uVar21;
  size_t sVar22;
  _func_int_void_ptr_char_ptr_size_t *p_Var23;
  char *pcVar24;
  long lVar25;
  bool bVar26;
  
  pcVar15 = (char *)*offset;
  pbVar1 = (byte *)(uri + (long)pcVar15);
  pbVar11 = (byte *)"";
  if (pcVar15 < len) {
    pbVar11 = pbVar1;
  }
  pcVar19 = (code *)((long)&((curi_settings *)pcVar15)->allocate + 1);
  *offset = (size_t)pcVar19;
  if ((*pbVar11 - 0x41 < 0x3a) &&
     ((0x3ffffff03ffffffU >> ((ulong)(*pbVar11 - 0x41) & 0x3f) & 1) != 0)) {
    cVar8 = curi_status_success;
    bVar26 = true;
  }
  else {
    cVar8 = curi_status_error;
    bVar26 = false;
  }
  p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)userData;
  if (bVar26) {
    do {
      pcVar24 = uri + (long)pcVar19;
      if (len <= pcVar19) {
        pcVar24 = "";
      }
      *offset = (size_t)(pcVar19 + 1);
      bVar6 = true;
      pcVar13 = pcVar19 + 1;
      switch(*pcVar24) {
      case '+':
      case '-':
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
        break;
      default:
        *offset = (size_t)pcVar19;
        bVar6 = false;
        pcVar13 = pcVar19;
      }
      pcVar19 = pcVar13;
    } while (bVar6);
    p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)&switchD_001aca69::switchdataD_001b4c08;
    if (bVar26) {
      p_Var23 = settings->scheme_callback;
      sVar20 = *offset - (long)pcVar15;
      pcVar15 = (char *)CONCAT71((int7)((ulong)pcVar15 >> 8),sVar20 == 0);
      cVar8 = curi_status_success;
      if (p_Var23 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar20 != 0) {
        uVar7 = (*p_Var23)(userData,(char *)pbVar1,sVar20);
        pcVar15 = (char *)(ulong)uVar7;
        cVar8 = (curi_status)(uVar7 == 0);
      }
    }
  }
  if (cVar8 == curi_status_success) {
    uVar3 = *offset;
    pcVar15 = uri + uVar3;
    if (len <= uVar3) {
      pcVar15 = "";
    }
    *offset = uVar3 + 1;
    cVar8 = (uint)(*(code *)&((curi_settings *)pcVar15)->allocate != (code)0x3a) * 2;
  }
  if (cVar8 != curi_status_success) goto LAB_001ad3a8;
  uVar3 = *offset;
  pcVar24 = uri + uVar3;
  if (len <= uVar3) {
    pcVar24 = "";
  }
  pcVar15 = (char *)(uVar3 + 1);
  *offset = (size_t)pcVar15;
  bVar26 = *pcVar24 != '/';
  if (!bVar26) {
    pcVar24 = uri + (long)pcVar15;
    if (len <= pcVar15) {
      pcVar24 = "";
    }
    *offset = uVar3 + 2;
    bVar26 = *pcVar24 != '/';
  }
  cVar8 = (uint)bVar26 * 2;
  if (bVar26 == 0) {
    uVar4 = *offset;
    uVar16 = uVar4;
    do {
      pcVar15 = uri + uVar16;
      if (len <= uVar16) {
        pcVar15 = "";
      }
      uVar21 = uVar16 + 1;
      *offset = uVar21;
      switch(*pcVar15) {
      case '!':
      case '$':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '=':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '~':
switchD_001acb6d_caseD_21:
        bVar26 = false;
        bVar6 = true;
        break;
      default:
switchD_001acb6d_caseD_22:
        bVar26 = true;
        bVar6 = false;
        break;
      case '%':
        pcVar15 = uri + uVar21;
        if (len <= uVar21) {
          pcVar15 = "";
        }
        uVar21 = uVar16 + 2;
        *offset = uVar21;
        bVar26 = true;
        p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)(ulong)((byte)*pcVar15 - 0x30);
        bVar6 = false;
        if (((byte)*pcVar15 - 0x30 < 0x37) &&
           (bVar6 = false, (0x7e0000007e03ffU >> ((ulong)p_Var23 & 0x3f) & 1) != 0)) {
          pcVar15 = uri + uVar21;
          if (len <= uVar21) {
            pcVar15 = "";
          }
          uVar21 = uVar16 + 3;
          *offset = uVar21;
          if ((0x36 < (byte)*pcVar15 - 0x30) ||
             ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar15 - 0x30) & 0x3f) & 1) == 0))
          goto switchD_001acb6d_caseD_22;
          goto switchD_001acb6d_caseD_21;
        }
      }
      if (bVar26) {
        *offset = uVar16;
        uVar21 = uVar16;
      }
      uVar16 = uVar21;
    } while (bVar6);
    uVar16 = *offset;
    pcVar15 = uri + uVar16;
    if (len <= uVar16) {
      pcVar15 = "";
    }
    *offset = uVar16 + 1;
    bVar26 = *pcVar15 != '@';
    pcVar15 = (char *)CONCAT71((int7)(uVar16 + 1 >> 8),bVar26);
    if (bVar26) {
      cVar8 = (uint)bVar26 * 2;
    }
    else {
      pcVar15 = (char *)settings->userinfo_callback;
      if (settings->url_decode == 0) {
        cVar8 = curi_status_success;
        p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)
                  CONCAT71((int7)((ulong)p_Var23 >> 8),
                           (curi_settings *)pcVar15 == (curi_settings *)0x0 || uVar16 == uVar4);
        if ((curi_settings *)pcVar15 != (curi_settings *)0x0 && uVar16 != uVar4) {
          uVar7 = (*(code *)pcVar15)();
          pcVar15 = (char *)(ulong)uVar7;
          cVar8 = (curi_status)(uVar7 == 0);
        }
      }
      else {
        pcVar17 = settings;
        p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)userData;
        cVar8 = handle_str_callback_url_decoded
                          ((_func_int_void_ptr_char_ptr_size_t *)pcVar15,uri + uVar4,uVar16 - uVar4,
                           settings,userData);
        pcVar15 = (char *)pcVar17;
      }
    }
    if (cVar8 == curi_status_error) {
      *offset = uVar4;
      cVar8 = curi_status_success;
    }
    if (cVar8 == curi_status_success) {
      uVar4 = *offset;
      pcVar24 = uri + uVar4;
      pcVar15 = "";
      if (uVar4 < len) {
        pcVar15 = pcVar24;
      }
      uVar16 = uVar4 + 1;
      *offset = uVar16;
      uVar18 = (undefined7)((ulong)pcVar24 >> 8);
      bVar26 = *pcVar15 != '[';
      pcVar15 = (char *)CONCAT71(uVar18,bVar26);
      if (bVar26) {
        cVar8 = (uint)bVar26 * 2;
      }
      else {
        pcVar15 = uri + uVar16;
        if (len <= uVar16) {
          pcVar15 = "";
        }
        *offset = uVar4 + 2;
        bVar26 = *pcVar15 != ':';
        pcVar15 = (char *)CONCAT71(uVar18,bVar26);
        uVar21 = uVar4 + 2;
        if (bVar26) {
          uVar21 = uVar16;
        }
        *offset = uVar21;
        if (bVar26) {
          cVar8 = parse_h16_and_colon(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
          lVar25 = 6;
          do {
            sVar20 = *offset;
            cVar9 = parse_h16_and_colon(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
            if (cVar9 == curi_status_error) {
              *offset = sVar20;
              cVar9 = cVar8;
            }
            cVar8 = cVar9;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
        else {
          cVar8 = (uint)bVar26 * 2;
        }
        if (cVar8 == curi_status_success) {
          uVar21 = *offset;
          pcVar15 = uri + uVar21;
          if (len <= uVar21) {
            pcVar15 = "";
          }
          *offset = uVar21 + 1;
          cVar8 = (uint)(*(char *)&((curi_settings *)pcVar15)->allocate != ':') * 2;
        }
        if (cVar8 == curi_status_error) {
          *offset = uVar16;
          cVar8 = curi_status_success;
        }
        if (cVar8 == curi_status_success) {
          sVar20 = *offset;
          lVar25 = 6;
          cVar9 = curi_status_success;
          do {
            sVar22 = *offset;
            cVar8 = parse_h16_and_colon(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
            if (cVar8 == curi_status_error) {
              *offset = sVar22;
              cVar8 = cVar9;
            }
            lVar25 = lVar25 + -1;
            cVar9 = cVar8;
          } while (lVar25 != 0);
          if (cVar8 == curi_status_success) {
            sVar22 = *offset;
            cVar8 = parse_h16_and_colon(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
            if (cVar8 == curi_status_success) {
              cVar8 = parse_h16(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
            }
            if (cVar8 == curi_status_error) {
              *offset = sVar22;
              cVar8 = curi_status_error;
            }
            if (cVar8 == curi_status_error) {
              sVar22 = *offset;
              cVar8 = parse_IPv4address(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
              if (cVar8 == curi_status_error) {
                *offset = sVar22;
                cVar8 = curi_status_error;
              }
            }
          }
          if (cVar8 == curi_status_error) {
            *offset = sVar20;
            cVar8 = curi_status_error;
          }
          if (cVar8 == curi_status_error) {
            sVar20 = *offset;
            cVar8 = parse_h16(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
            if (cVar8 == curi_status_error) {
              *offset = sVar20;
              cVar8 = curi_status_error;
            }
          }
        }
        if (cVar8 == curi_status_error) {
          *offset = uVar16;
          cVar8 = curi_status_error;
        }
        if (cVar8 == curi_status_error) {
          uVar16 = *offset;
          pcVar12 = uri + uVar16;
          if (len <= uVar16) {
            pcVar12 = "";
          }
          pcVar15 = (char *)(uVar16 + 1);
          *offset = (size_t)pcVar15;
          if (*pcVar12 != 'v') {
            cVar8 = (uint)(*pcVar12 != 'v') * 2;
          }
          else {
            pcVar12 = uri + (long)pcVar15;
            if (len <= pcVar15) {
              pcVar12 = "";
            }
            *offset = uVar16 + 2;
            bVar14 = *pcVar12 - 0x30;
            pcVar15 = (char *)CONCAT71((int7)(uVar16 + 2 >> 8),bVar14);
            cVar8 = curi_status_error;
            if (bVar14 < 0x37) {
              pcVar15 = &DAT_001b5764;
              cVar8 = *(curi_status *)(&DAT_001b5764 + (ulong)bVar14 * 4);
            }
          }
          if (cVar8 == curi_status_success) {
            uVar21 = *offset;
            pcVar15 = uri + uVar21;
            if (len <= uVar21) {
              pcVar15 = "";
            }
            *offset = uVar21 + 1;
            cVar8 = (uint)(*(char *)&((curi_settings *)pcVar15)->allocate != '.') * 2;
          }
          if (cVar8 == curi_status_success) {
            sVar20 = *offset;
            cVar8 = parse_unreserved(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
            if (cVar8 == curi_status_error) {
              *offset = sVar20;
              cVar8 = curi_status_error;
            }
            if (cVar8 == curi_status_error) {
              pcVar15 = (char *)*offset;
              pcVar12 = uri + (long)pcVar15;
              if (len <= pcVar15) {
                pcVar12 = "";
              }
              *offset = (size_t)((long)&((curi_settings *)pcVar15)->allocate + 1);
              if ((ulong)(byte)*pcVar12 < 0x3e) {
                bVar26 = false;
                cVar8 = curi_status_success;
                if ((0x28001fd200000000U >> ((ulong)(byte)*pcVar12 & 0x3f) & 1) == 0)
                goto LAB_001ad4a7;
              }
              else {
LAB_001ad4a7:
                cVar8 = curi_status_error;
                bVar26 = true;
              }
              if (bVar26) {
                *offset = (size_t)pcVar15;
                cVar8 = curi_status_error;
              }
            }
            if (cVar8 == curi_status_error) {
              pcVar15 = (char *)*offset;
              pcVar12 = uri + (long)pcVar15;
              if (len <= pcVar15) {
                pcVar12 = "";
              }
              pcVar17 = (curi_settings *)((long)&((curi_settings *)pcVar15)->allocate + 1);
              *offset = (size_t)pcVar17;
              cVar2 = *pcVar12;
              if (cVar2 == ':') {
                pcVar15 = (char *)pcVar17;
              }
              *offset = (size_t)pcVar15;
              cVar8 = (uint)(cVar2 != ':') * 2;
            }
            do {
              if (cVar8 != curi_status_success) goto LAB_001ad064;
              sVar20 = *offset;
              cVar8 = parse_unreserved(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
              if (cVar8 == curi_status_error) {
                *offset = sVar20;
                cVar8 = curi_status_error;
              }
              if (cVar8 == curi_status_error) {
                pcVar15 = (char *)*offset;
                pcVar12 = uri + (long)pcVar15;
                if (len <= pcVar15) {
                  pcVar12 = "";
                }
                *offset = (size_t)((long)&((curi_settings *)pcVar15)->allocate + 1);
                if ((ulong)(byte)*pcVar12 < 0x3e) {
                  bVar26 = false;
                  cVar8 = curi_status_success;
                  if ((0x28001fd200000000U >> ((ulong)(byte)*pcVar12 & 0x3f) & 1) == 0)
                  goto LAB_001ad059;
                }
                else {
LAB_001ad059:
                  cVar8 = curi_status_error;
                  bVar26 = true;
                }
                if (bVar26) {
                  *offset = (size_t)pcVar15;
                  cVar8 = curi_status_error;
                }
              }
              if (cVar8 == curi_status_error) {
                pcVar15 = (char *)*offset;
                pcVar12 = uri + (long)pcVar15;
                if (len <= pcVar15) {
                  pcVar12 = "";
                }
                pcVar17 = (curi_settings *)((long)&((curi_settings *)pcVar15)->allocate + 1);
                *offset = (size_t)pcVar17;
                cVar2 = *pcVar12;
                if (cVar2 == ':') {
                  pcVar15 = (char *)pcVar17;
                }
                *offset = (size_t)pcVar15;
                cVar8 = (uint)(cVar2 != ':') * 2;
              }
            } while (cVar8 != curi_status_error);
            cVar8 = curi_status_success;
          }
LAB_001ad064:
          if (cVar8 == curi_status_error) {
            *offset = uVar16;
            cVar8 = curi_status_error;
          }
        }
      }
      if (cVar8 == curi_status_success) {
        uVar16 = *offset;
        pcVar15 = uri + uVar16;
        if (len <= uVar16) {
          pcVar15 = "";
        }
        *offset = uVar16 + 1;
        cVar8 = (uint)(*(char *)&((curi_settings *)pcVar15)->allocate != ']') * 2;
      }
      if (cVar8 == curi_status_error) {
        *offset = uVar4;
        cVar8 = curi_status_error;
      }
      if (cVar8 == curi_status_error) {
        sVar20 = *offset;
        cVar8 = parse_IPv4address(uri,len,offset,(curi_settings *)pcVar15,p_Var23);
        if (cVar8 == curi_status_error) {
          *offset = sVar20;
          cVar8 = curi_status_error;
        }
      }
      if (cVar8 == curi_status_error) {
        pcVar15 = (char *)*offset;
        do {
          pcVar12 = uri + (long)pcVar15;
          if (len <= pcVar15) {
            pcVar12 = "";
          }
          pcVar17 = (curi_settings *)((long)&((curi_settings *)pcVar15)->allocate + 1);
          *offset = (size_t)pcVar17;
          switch(*pcVar12) {
          case '!':
          case '$':
          case '&':
          case '\'':
          case '(':
          case ')':
          case '*':
          case '+':
          case ',':
          case '-':
          case '.':
          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case ';':
          case '=':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':
          case 'G':
          case 'H':
          case 'I':
          case 'J':
          case 'K':
          case 'L':
          case 'M':
          case 'N':
          case 'O':
          case 'P':
          case 'Q':
          case 'R':
          case 'S':
          case 'T':
          case 'U':
          case 'V':
          case 'W':
          case 'X':
          case 'Y':
          case 'Z':
          case '_':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'g':
          case 'h':
          case 'i':
          case 'j':
          case 'k':
          case 'l':
          case 'm':
          case 'n':
          case 'o':
          case 'p':
          case 'q':
          case 'r':
          case 's':
          case 't':
          case 'u':
          case 'v':
          case 'w':
          case 'x':
          case 'y':
          case 'z':
          case '~':
switchD_001ad128_caseD_21:
            bVar26 = false;
            bVar6 = true;
            break;
          default:
switchD_001ad128_caseD_22:
            bVar26 = true;
            bVar6 = false;
            break;
          case '%':
            pcVar12 = uri + (long)pcVar17;
            if (len <= pcVar17) {
              pcVar12 = "";
            }
            pcVar17 = (curi_settings *)((long)&((curi_settings *)pcVar15)->allocate + 2);
            *offset = (size_t)pcVar17;
            bVar26 = true;
            p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)(ulong)((byte)*pcVar12 - 0x30);
            bVar6 = false;
            if (((byte)*pcVar12 - 0x30 < 0x37) &&
               (bVar6 = false, (0x7e0000007e03ffU >> ((ulong)p_Var23 & 0x3f) & 1) != 0)) {
              pcVar12 = uri + (long)pcVar17;
              if (len <= pcVar17) {
                pcVar12 = "";
              }
              pcVar17 = (curi_settings *)((long)&((curi_settings *)pcVar15)->allocate + 3);
              *offset = (size_t)pcVar17;
              if ((0x36 < (byte)*pcVar12 - 0x30) ||
                 ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar12 - 0x30) & 0x3f) & 1) == 0))
              goto switchD_001ad128_caseD_22;
              goto switchD_001ad128_caseD_21;
            }
          }
          if (bVar26) {
            *offset = (size_t)pcVar15;
            pcVar17 = (curi_settings *)pcVar15;
          }
          pcVar15 = (char *)pcVar17;
        } while (bVar6);
        cVar8 = curi_status_success;
      }
      if (cVar8 == curi_status_success) {
        pcVar15 = (char *)settings->host_callback;
        if (settings->url_decode == 0) {
          cVar8 = curi_status_success;
          if ((curi_settings *)pcVar15 != (curi_settings *)0x0 && *offset != uVar4) {
            uVar7 = (*(code *)pcVar15)(userData,pcVar24);
            pcVar15 = (char *)(ulong)uVar7;
            cVar8 = (curi_status)(uVar7 == 0);
          }
        }
        else {
          pcVar17 = settings;
          p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)userData;
          cVar8 = handle_str_callback_url_decoded
                            ((_func_int_void_ptr_char_ptr_size_t *)pcVar15,pcVar24,*offset - uVar4,
                             settings,userData);
          pcVar15 = (char *)pcVar17;
        }
      }
    }
    if (cVar8 == curi_status_success) {
      p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)*offset;
      pcVar24 = uri + (long)p_Var23;
      if (len <= p_Var23) {
        pcVar24 = "";
      }
      pcVar19 = p_Var23 + 1;
      *offset = (size_t)pcVar19;
      bVar26 = *pcVar24 != ':';
      pcVar15 = (char *)CONCAT71((int7)((ulong)pcVar15 >> 8),bVar26);
      if (bVar26) {
        cVar8 = (uint)bVar26 * 2;
      }
      else {
        pcVar15 = "";
        if (pcVar19 < len) {
          pcVar15 = uri + (long)pcVar19;
        }
        if ((byte)(*pcVar15 - 0x30U) < 10) {
          pcVar13 = p_Var23 + 2;
          do {
            *offset = (size_t)pcVar13;
            pcVar15 = uri + (long)pcVar13;
            if (len <= pcVar13) {
              pcVar15 = "";
            }
            pcVar13 = pcVar13 + 1;
          } while ((byte)(*pcVar15 - 0x30U) < 10);
        }
        pcVar13 = (code *)*offset;
        pcVar15 = (char *)settings->portStr_callback;
        cVar8 = curi_status_success;
        if ((curi_settings *)pcVar15 != (curi_settings *)0x0 && pcVar13 != pcVar19) {
          uVar7 = (*(code *)pcVar15)(userData);
          pcVar15 = (char *)(ulong)uVar7;
          cVar8 = (curi_status)(uVar7 == 0);
        }
        if ((pcVar13 != pcVar19) && (cVar8 == curi_status_success)) {
          p_Var5 = settings->port_callback;
          if (p_Var5 == (_func_int_void_ptr_uint *)0x0) {
            cVar8 = curi_status_success;
          }
          else {
            uVar7 = atoi(uri + (long)pcVar19);
            uVar7 = (*p_Var5)(userData,uVar7);
            pcVar15 = (char *)(ulong)uVar7;
            cVar8 = (curi_status)(uVar7 == 0);
          }
        }
      }
      if (cVar8 == curi_status_error) {
        *offset = (size_t)p_Var23;
        cVar8 = curi_status_success;
      }
    }
  }
  if (cVar8 == curi_status_success) {
    sVar20 = *offset;
    pcVar15 = (char *)settings;
    p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)userData;
    cVar8 = parse_segments(uri,len,offset,settings,userData);
    if (cVar8 == curi_status_success) {
      pcVar15 = (char *)userData;
      cVar8 = handle_path(uri + sVar20,*offset - sVar20,settings,userData);
    }
  }
  if (cVar8 == curi_status_error) {
    *offset = uVar3;
    cVar8 = curi_status_error;
  }
  if (cVar8 == curi_status_error) {
    pcVar15 = (char *)settings;
    p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)userData;
    cVar8 = parse_path(uri,len,offset,settings,userData);
  }
LAB_001ad3a8:
  if (cVar8 == curi_status_success) {
    sVar20 = *offset;
    pcVar15 = (char *)settings;
    p_Var23 = (_func_int_void_ptr_char_ptr_size_t *)userData;
    cVar8 = parse_query(uri,len,offset,settings,userData,1);
    if (cVar8 == curi_status_error) {
      *offset = sVar20;
      cVar8 = curi_status_success;
    }
  }
  if (cVar8 == curi_status_success) {
    uVar3 = *offset;
    pcVar24 = "";
    if (uVar3 < len) {
      pcVar24 = uri + uVar3;
    }
    sVar20 = uVar3 + 1;
    *offset = sVar20;
    bVar26 = *pcVar24 != '#';
    pcVar17 = (curi_settings *)CONCAT71((int7)((ulong)pcVar15 >> 8),bVar26);
    if (bVar26) {
      cVar8 = (uint)bVar26 * 2;
    }
    else {
      do {
        sVar22 = *offset;
        cVar8 = parse_query_fragment_char(uri,len,offset,pcVar17,p_Var23);
      } while (cVar8 == curi_status_success);
      *offset = sVar22;
      cVar8 = curi_status_success;
    }
    if (cVar8 == curi_status_success) {
      sVar22 = *offset - sVar20;
      p_Var23 = settings->fragment_callback;
      if (settings->url_decode == 0) {
        cVar8 = curi_status_success;
        if (p_Var23 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && *offset != sVar20) {
          iVar10 = (*p_Var23)(userData,uri + sVar20,sVar22);
          cVar8 = (curi_status)(iVar10 == 0);
        }
      }
      else {
        cVar8 = handle_str_callback_url_decoded(p_Var23,uri + sVar20,sVar22,settings,userData);
      }
    }
    if (cVar8 == curi_status_error) {
      *offset = uVar3;
      cVar8 = curi_status_success;
    }
  }
  return cVar8;
}

Assistant:

static curi_status parse_full_uri(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // URI = scheme ":" hier-part [ query ] [ fragment ]
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_scheme(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char(':', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_hier_part(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        TRY(status, offset, parse_query(uri, len, offset, settings, userData, 1));

    if (status == curi_status_success)
        TRY(status, offset, parse_fragment(uri, len, offset, settings, userData));

    return status;
}